

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_error qpdf_get_error(qpdf_data qpdf)

{
  _qpdf_error *this;
  __shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if ((qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this = (_qpdf_error *)0x0;
  }
  else {
    this = &qpdf->tmp_error;
    std::__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2> *)this,
               &(qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(qpdf->error).super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  return this;
}

Assistant:

qpdf_error
qpdf_get_error(qpdf_data qpdf)
{
    if (qpdf->error.get()) {
        qpdf->tmp_error.exc = qpdf->error;
        qpdf->error = nullptr;
        QTC::TC("qpdf", "qpdf-c qpdf_get_error returned error");
        return &qpdf->tmp_error;
    } else {
        return nullptr;
    }
}